

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::SequenceDeclarationSyntax::setChild
          (SequenceDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar2;
  SyntaxNode *pSVar3;
  NamedBlockClauseSyntax *pNVar4;
  AssertionItemPortListSyntax *pAVar5;
  SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *pSVar6;
  logic_error *this_00;
  Token TVar7;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 10) {
    switch(index) {
    case 0:
      pSVar3 = TokenOrSyntax::node(&child);
      pSVar2 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (pSVar3);
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
           (pSVar2->super_SyntaxListBase).childCount;
      sVar1 = (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 1:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->keyword).kind = TVar7.kind;
      (this->keyword).field_0x2 = TVar7._2_1_;
      (this->keyword).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->keyword).rawLen = TVar7.rawLen;
      (this->keyword).info = TVar7.info;
      break;
    case 2:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->name).kind = TVar7.kind;
      (this->name).field_0x2 = TVar7._2_1_;
      (this->name).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->name).rawLen = TVar7.rawLen;
      (this->name).info = TVar7.info;
      break;
    case 3:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        pAVar5 = (AssertionItemPortListSyntax *)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        pAVar5 = SyntaxNode::as<slang::syntax::AssertionItemPortListSyntax>(pSVar3);
      }
      this->portList = pAVar5;
      break;
    case 4:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->semi).kind = TVar7.kind;
      (this->semi).field_0x2 = TVar7._2_1_;
      (this->semi).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->semi).rawLen = TVar7.rawLen;
      (this->semi).info = TVar7.info;
      break;
    case 5:
      pSVar3 = TokenOrSyntax::node(&child);
      pSVar6 = SyntaxNode::
               as<slang::syntax::SyntaxList<slang::syntax::LocalVariableDeclarationSyntax>>(pSVar3);
      (this->variables).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar6->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->variables).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar6->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->variables).super_SyntaxListBase.childCount = (pSVar6->super_SyntaxListBase).childCount;
      sVar1 = (pSVar6->
              super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>).
              size_;
      (this->variables).
      super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar6->
           super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>).
           data_;
      (this->variables).
      super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>.size_ =
           sVar1;
      break;
    case 6:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p =
             (pointer)SyntaxNode::as<slang::syntax::SequenceExprSyntax>(pSVar3);
      }
      not_null<slang::syntax::SequenceExprSyntax*>::
      not_null<slang::syntax::SequenceExprSyntax*,void>
                ((not_null<slang::syntax::SequenceExprSyntax*> *)&local_b8,
                 (SequenceExprSyntax **)&local_d8);
      (this->seqExpr).ptr = (SequenceExprSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 7:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->optionalSemi).kind = TVar7.kind;
      (this->optionalSemi).field_0x2 = TVar7._2_1_;
      (this->optionalSemi).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->optionalSemi).rawLen = TVar7.rawLen;
      (this->optionalSemi).info = TVar7.info;
      break;
    case 8:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->end).kind = TVar7.kind;
      (this->end).field_0x2 = TVar7._2_1_;
      (this->end).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->end).rawLen = TVar7.rawLen;
      (this->end).info = TVar7.info;
      break;
    case 9:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        pNVar4 = (NamedBlockClauseSyntax *)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        pNVar4 = SyntaxNode::as<slang::syntax::NamedBlockClauseSyntax>(pSVar3);
      }
      this->endBlockName = pNVar4;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&local_98,0x2d2a);
  std::operator+(&local_38,&local_58,&local_98);
  std::operator+(&local_d8,&local_38,": ");
  std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void SequenceDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: name = child.token(); return;
        case 3: portList = child.node() ? &child.node()->as<AssertionItemPortListSyntax>() : nullptr; return;
        case 4: semi = child.token(); return;
        case 5: variables = child.node()->as<SyntaxList<LocalVariableDeclarationSyntax>>(); return;
        case 6: seqExpr = child.node() ? &child.node()->as<SequenceExprSyntax>() : nullptr; return;
        case 7: optionalSemi = child.token(); return;
        case 8: end = child.token(); return;
        case 9: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}